

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O1

int lws_urldecode(char *string,char *escaped,int len)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  bool bVar5;
  
  bVar5 = len != 0;
  bVar1 = *escaped;
  if (bVar1 != 0 && bVar5) {
    bVar2 = 0;
    iVar4 = 0;
    do {
      while (escaped = (char *)((byte *)escaped + 1), iVar4 != 0) {
        if (iVar4 == 1) {
          bVar2 = bVar1 - 0x30;
          if (9 < bVar2) {
            if ((byte)(bVar1 + 0x9f) < 6) {
              bVar2 = bVar1 + 0xa9;
            }
            else {
              bVar2 = bVar1 - 0x37;
              if (5 < (byte)(bVar1 + 0xbf)) {
                bVar2 = 0xff;
              }
            }
          }
          if ((char)bVar2 < '\0') {
            return -1;
          }
          bVar2 = bVar2 << 4;
          iVar4 = 2;
        }
        else {
          bVar3 = bVar1 - 0x30;
          if (9 < bVar3) {
            if ((byte)(bVar1 + 0x9f) < 6) {
              bVar3 = bVar1 + 0xa9;
            }
            else {
              bVar3 = bVar1 - 0x37;
              if (5 < (byte)(bVar1 + 0xbf)) {
                bVar3 = 0xff;
              }
            }
          }
          if ((char)bVar3 < '\0') {
            return -1;
          }
          *string = bVar3 | bVar2;
LAB_0010f16d:
          string = (char *)((byte *)string + 1);
          len = len + -1;
          iVar4 = 0;
        }
        bVar1 = *escaped;
        if (bVar1 == 0) goto LAB_0010f18b;
LAB_0010f183:
        bVar5 = len != 0;
        if (len == 0) goto LAB_0010f18b;
      }
      if (bVar1 != 0x25) {
        if (bVar1 != 0x2b) {
          *string = bVar1;
          goto LAB_0010f16d;
        }
        *string = 0x20;
        string = (char *)((byte *)string + 1);
        len = len + -1;
        bVar1 = *escaped;
        if (bVar1 != 0) {
          iVar4 = 0;
          goto LAB_0010f183;
        }
        break;
      }
      bVar1 = *escaped;
      iVar4 = 1;
    } while ((bool)(bVar1 != 0 & bVar5));
  }
LAB_0010f18b:
  *string = 0;
  return 0;
}

Assistant:

int
lws_urldecode(char *string, const char *escaped, int len)
{
	int state = 0, n;
	char sum = 0;

	while (*escaped && len) {
		switch (state) {
		case 0:
			if (*escaped == '%') {
				state++;
				escaped++;
				continue;
			}
			if (*escaped == '+') {
				escaped++;
				*string++ = ' ';
				len--;
				continue;
			}
			*string++ = *escaped++;
			len--;
			break;
		case 1:
			n = char_to_hex(*escaped);
			if (n < 0)
				return -1;
			escaped++;
			sum = n << 4;
			state++;
			break;

		case 2:
			n = char_to_hex(*escaped);
			if (n < 0)
				return -1;
			escaped++;
			*string++ = sum | n;
			len--;
			state = 0;
			break;
		}

	}
	*string = '\0';

	return 0;
}